

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

char * mg_get_mime_type(char *path,char *default_mime_type)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  sVar2 = strlen(path);
  lVar4 = 0x10;
  while( true ) {
    if (lVar4 == 0x478) {
      return default_mime_type;
    }
    lVar3 = sVar2 - *(ulong *)((long)&__do_global_dtors_aux_fini_array_entry + lVar4);
    if ((*(ulong *)((long)&__do_global_dtors_aux_fini_array_entry + lVar4) <= sVar2 && lVar3 != 0)
       && (iVar1 = mg_strcasecmp(path + lVar3,
                                 *(char **)((long)&__frame_dummy_init_array_entry + lVar4)),
          iVar1 == 0)) break;
    lVar4 = lVar4 + 0x18;
  }
  return *(char **)((long)&static_builtin_mime_types[0].extension + lVar4);
}

Assistant:

const char *mg_get_mime_type(const char *path, const char *default_mime_type) {
  const char *ext;
  size_t i, path_len;

  path_len = strlen(path);

  for (i = 0; static_builtin_mime_types[i].extension != NULL; i++) {
    ext = path + (path_len - static_builtin_mime_types[i].ext_len);
    if (path_len > static_builtin_mime_types[i].ext_len &&
        mg_strcasecmp(ext, static_builtin_mime_types[i].extension) == 0) {
      return static_builtin_mime_types[i].mime_type;
    }
  }

  return default_mime_type;
}